

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Float pbrt::AngleBetween<float>(Vector3<float> *v1,Vector3<float> *v2)

{
  float fVar1;
  undefined1 extraout_var_00 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar8 [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector3<float> VVar11;
  undefined1 extraout_var [60];
  undefined1 auVar5 [56];
  
  fVar1 = Dot<float>(v1,v2);
  auVar8 = ZEXT1260(SUB1612(ZEXT816(0) << 0x40,4));
  if (0.0 <= fVar1) {
    auVar5 = extraout_var_00;
    VVar11 = Tuple3<pbrt::Vector3,float>::operator-(&v2->super_Tuple3<pbrt::Vector3,_float>,v1);
    auVar7._0_4_ = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._4_60_ = auVar8;
    auVar4._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar5;
    auVar10._0_4_ =
         VVar11.super_Tuple3<pbrt::Vector3,_float>.x * VVar11.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar10._4_4_ =
         VVar11.super_Tuple3<pbrt::Vector3,_float>.y * VVar11.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar10._8_4_ = auVar5._0_4_ * auVar5._0_4_;
    auVar10._12_4_ = auVar5._4_4_ * auVar5._4_4_;
    auVar10 = vmovshdup_avx(auVar10);
    auVar10 = vfmadd231ss_fma(auVar10,auVar4._0_16_,auVar4._0_16_);
    auVar10 = vfmadd231ss_fma(auVar10,auVar7._0_16_,auVar7._0_16_);
    auVar10 = vsqrtss_avx(auVar10,auVar10);
    fVar1 = SafeASin(auVar10._0_4_ * 0.5);
    fVar1 = fVar1 + fVar1;
  }
  else {
    auVar5 = extraout_var_00;
    VVar11 = Tuple3<pbrt::Vector3,float>::operator+(&v1->super_Tuple3<pbrt::Vector3,_float>,v2);
    auVar6._0_4_ = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._4_60_ = auVar8;
    auVar2._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar2._8_56_ = auVar5;
    auVar9._0_4_ = VVar11.super_Tuple3<pbrt::Vector3,_float>.x *
                   VVar11.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar9._4_4_ = VVar11.super_Tuple3<pbrt::Vector3,_float>.y *
                   VVar11.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar9._8_4_ = auVar5._0_4_ * auVar5._0_4_;
    auVar9._12_4_ = auVar5._4_4_ * auVar5._4_4_;
    auVar10 = vmovshdup_avx(auVar9);
    auVar10 = vfmadd231ss_fma(auVar10,auVar2._0_16_,auVar2._0_16_);
    auVar10 = vfmadd231ss_fma(auVar10,auVar6._0_16_,auVar6._0_16_);
    auVar10 = vsqrtss_avx(auVar10,auVar10);
    auVar3._0_4_ = SafeASin(auVar10._0_4_ * 0.5);
    auVar3._4_60_ = extraout_var;
    auVar10 = vfmadd213ss_fma(auVar3._0_16_,SUB6416(ZEXT464(0xc0000000),0),ZEXT416(0x40490fdb));
    fVar1 = auVar10._0_4_;
  }
  return fVar1;
}

Assistant:

PBRT_CPU_GPU inline Float AngleBetween(const Vector3<T> &v1, const Vector3<T> &v2) {
    if (Dot(v1, v2) < 0)
        return Pi - 2 * SafeASin(Length(v1 + v2) / 2);
    else
        return 2 * SafeASin(Length(v2 - v1) / 2);
}